

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O2

void PPC_init(MCRegisterInfo *MRI)

{
  uint unaff_retaddr;
  uint16_t *in_stack_00000008;
  undefined4 in_stack_ffffffffffffffec;
  uint16_t *in_stack_fffffffffffffff8;
  
  MCRegisterInfo_InitMCRegisterInfo
            (MRI,PPCRegDesc,0x136,0,0,PPCMCRegisterClasses,0x3a7dc0,(uint16_t (*) [2])0x0,0x3a7e60,
             (MCPhysReg *)CONCAT44(in_stack_ffffffffffffffec,8),(char *)0x0,
             in_stack_fffffffffffffff8,unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

void PPC_init(MCRegisterInfo *MRI)
{
	/*
	   InitMCRegisterInfo(PPCRegDesc, 310, RA, PC,
	   PPCMCRegisterClasses, 23,
	   PPCRegUnitRoots,
	   138,
	   PPCRegDiffLists,
	   PPCLaneMaskLists,
	   PPCRegStrings,
	   PPCRegClassStrings,
	   PPCSubRegIdxLists,
	   8,
	   PPCSubRegIdxRanges,
	   PPCRegEncodingTable);
	 */


	MCRegisterInfo_InitMCRegisterInfo(MRI, PPCRegDesc, 310,
			0, 0,
			PPCMCRegisterClasses, 23,
			0, 0,
			PPCRegDiffLists,
			0,
			PPCSubRegIdxLists, 8,
			0);
}